

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

cmListFileBacktrace __thiscall
TargetPropertyEntryString::GetBacktrace(TargetPropertyEntryString *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  cmListFileBacktrace cVar1;
  TargetPropertyEntryString *this_local;
  
  cmListFileBacktrace::cmListFileBacktrace
            ((cmListFileBacktrace *)this,(cmListFileBacktrace *)(in_RSI + 0x30));
  cVar1.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  cVar1.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (cmListFileBacktrace)
         cVar1.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

cmListFileBacktrace GetBacktrace() const override
  {
    return this->PropertyValue.Backtrace;
  }